

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O0

void Gia_CreateHeader(FILE *pFile,int Type,int Size,uchar *pBuffer)

{
  int __fd;
  ssize_t sVar1;
  ssize_t n;
  ssize_t bytes_written;
  int fd;
  uchar *pBuffer_local;
  int Size_local;
  int Type_local;
  FILE *pFile_local;
  
  fprintf((FILE *)pFile,"%.6d",(ulong)(uint)Type);
  fprintf((FILE *)pFile," ");
  fprintf((FILE *)pFile,"%.16d",(ulong)(uint)Size);
  fprintf((FILE *)pFile," ");
  fflush((FILE *)pFile);
  __fd = fileno((FILE *)pFile);
  n = 0;
  while( true ) {
    if (Size <= n) {
      return;
    }
    sVar1 = write(__fd,pBuffer + n,Size - n);
    if (sVar1 < 0) break;
    n = sVar1 + n;
  }
  fprintf(_stderr,"BridgeMode: failed to send package; aborting\n");
  fflush(_stderr);
  _exit(0xff);
}

Assistant:

void Gia_CreateHeader( FILE * pFile, int Type, int Size, unsigned char * pBuffer )
{
    fprintf( pFile, "%.6d", Type );
    fprintf( pFile, " " );
    fprintf( pFile, "%.16d", Size );
    fprintf( pFile, " " );
#if !defined(LIN) && !defined(LIN64)
    {
    int RetValue;
    RetValue = fwrite( pBuffer, Size, 1, pFile );
    assert( RetValue == 1 || Size == 0);
    fflush( pFile );
    }
#else
    fflush(pFile);
    int fd = fileno(pFile);

    ssize_t bytes_written = 0;
    while (bytes_written < Size){
        ssize_t n = write(fd, &pBuffer[bytes_written], Size - bytes_written);
        if (n < 0){
            fprintf(stderr, "BridgeMode: failed to send package; aborting\n"); fflush(stderr);
            _exit(255);
        }
        bytes_written += n;
    }
#endif
}